

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationReadWriteCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char cVar1;
  string *psVar2;
  long *plVar3;
  undefined8 *puVar4;
  ostream *poVar5;
  long *plVar6;
  ulong *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  string localID;
  ostringstream buf;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  long local_3c0;
  undefined8 uStack_3b8;
  ulong local_3b0;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  string *local_348;
  long *local_340 [2];
  long local_330 [2];
  undefined1 local_320 [376];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_348 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (0 < *(int *)((long)this + 0x90)) {
    local_3b0 = 0;
    iVar9 = 0;
    do {
      cVar1 = *(char *)((long)this + 0x7e);
      if (cVar1 == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,iVar9 + 1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0x1c98dc3);
        local_368 = &local_358;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_358 = *plVar6;
          lStack_350 = plVar3[3];
        }
        else {
          local_358 = *plVar6;
          local_368 = (long *)*plVar3;
        }
        local_360 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
        local_3a8 = &local_398;
        puVar7 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar7) {
          local_398 = *puVar7;
          lStack_390 = plVar3[3];
        }
        else {
          local_398 = *puVar7;
          local_3a8 = (ulong *)*plVar3;
        }
        local_3a0 = plVar3[1];
        *plVar3 = (long)puVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,(int)local_3b0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar10 = 0xf;
        if (local_3a8 != &local_398) {
          uVar10 = local_398;
        }
        if (uVar10 < (ulong)(local_380 + local_3a0)) {
          uVar10 = 0xf;
          if (local_388 != local_378) {
            uVar10 = local_378[0];
          }
          if (uVar10 < (ulong)(local_380 + local_3a0)) goto LAB_014eaac4;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_3a8);
        }
        else {
LAB_014eaac4:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_388);
        }
        local_3d0 = &local_3c0;
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_3c0 = *plVar3;
          uStack_3b8 = puVar4[3];
        }
        else {
          local_3c0 = *plVar3;
          local_3d0 = (long *)*puVar4;
        }
        local_3c8 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_3d0);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_3e0 = *plVar6;
          lStack_3d8 = plVar3[3];
          local_3f0 = &local_3e0;
        }
        else {
          local_3e0 = *plVar6;
          local_3f0 = (long *)*plVar3;
        }
        local_3e8 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
      }
      else {
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f0,"gl_LocalInvocationID.xy","");
      }
      if (cVar1 != '\0') {
        if (local_3d0 != &local_3c0) {
          operator_delete(local_3d0,local_3c0 + 1);
        }
        if (local_388 != local_378) {
          operator_delete(local_388,local_378[0] + 1);
        }
        if (cVar1 != '\0') {
          if (local_3a8 != &local_398) {
            operator_delete(local_3a8,local_398 + 1);
          }
          if (local_368 != &local_358) {
            operator_delete(local_368,local_358 + 1);
          }
          if (local_340[0] != local_330) {
            operator_delete(local_340[0],local_330[0] + 1);
          }
        }
      }
      if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,
                     "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(",0x3b);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_320,(char *)local_3f0,local_3e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
          lVar8 = 0x10;
          pcVar11 = ")], 123) == 0);\n";
        }
        else {
          if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eac42;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"\tallOk = allOk && (sb_store.values[getIndex(",0x2c);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_320,(char *)local_3f0,local_3e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
          lVar8 = 10;
          pcVar11 = ")] == 0);\n";
        }
LAB_014eae08:
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar8);
      }
      else {
LAB_014eac42:
        if (*(int *)((long)this + 0x78) == 1) {
          if (*(char *)((long)this + 0x7c) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(",0x39);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_320,(char *)local_3f0,local_3e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
            lVar8 = 0xf;
            pcVar11 = "), 123) == 0);\n";
          }
          else {
            if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eae10;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"\tallOk = allOk && (imageLoad(u_image, getCoord(",0x2f)
            ;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_320,(char *)local_3f0,local_3e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
            lVar8 = 0xc;
            pcVar11 = ")).x == 0);\n";
          }
          goto LAB_014eae08;
        }
      }
LAB_014eae10:
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,local_3e0 + 1);
      }
      iVar9 = iVar9 + 1;
      local_3b0 = (ulong)((int)local_3b0 + 2);
    } while (iVar9 < *(int *)((long)this + 0x90));
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(local_1a8,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)this + 0x90)) {
    iVar9 = 0;
    do {
      if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,
                     "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ",0x3d);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
          lVar8 = 0xf;
          pcVar11 = ")], groupNdx);\n";
        }
        else {
          if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eaec6;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ",
                     0x33);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
          lVar8 = 0xf;
          pcVar11 = ")] = groupNdx;\n";
        }
LAB_014eafa1:
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar8);
      }
      else {
LAB_014eaec6:
        if (*(int *)((long)this + 0x78) == 1) {
          if (*(char *)((long)this + 0x7c) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ",0x3b);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
            lVar8 = 0x13;
            pcVar11 = "), int(groupNdx));\n";
          }
          else {
            if (*(char *)((long)this + 0x7c) != '\0') goto LAB_014eafa9;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, ",0x37);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
            lVar8 = 0x23;
            pcVar11 = "), ivec4(int(groupNdx), 0, 0, 0));\n";
          }
          goto LAB_014eafa1;
        }
      }
LAB_014eafa9:
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)((long)this + 0x90));
  }
  psVar2 = local_348;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return psVar2;
}

Assistant:

std::string InvocationReadWriteCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 123) == 0);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == 0);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 123) == 0);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == 0);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), int(groupNdx));\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(int(groupNdx), 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}